

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O2

int AF_A_AlertMonsters(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  TObjPtr<AActor> *obj;
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  AActor *pAVar3;
  AActor *pAVar4;
  AActor *emitter;
  char *__assertion;
  uint uVar5;
  uint uVar6;
  double maxdist;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0054ec88;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_0054ec78;
  emitter = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (emitter == (AActor *)0x0) goto LAB_0054eac8;
    bVar2 = DObject::IsKindOf((DObject *)emitter,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0054ec88;
    }
  }
  else {
    if (emitter != (AActor *)0x0) goto LAB_0054ec78;
LAB_0054eac8:
    emitter = (AActor *)0x0;
  }
  uVar5 = 0;
  maxdist = 0.0;
  uVar6 = 0;
  if (numparam == 1) goto LAB_0054ebcc;
  VVar1 = param[1].field_0.field_3.Type;
  if (VVar1 != 0xff) {
    if (VVar1 != '\x03') {
LAB_0054ec78:
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_0054ec88;
    }
    this = (DObject *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if ((this != (DObject *)0x0) &&
         (bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar2)) {
        __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_0054ec88;
      }
    }
    else if (this != (DObject *)0x0) goto LAB_0054ec78;
  }
  maxdist = 0.0;
  uVar6 = uVar5;
  if (2 < (uint)numparam) {
    VVar1 = param[2].field_0.field_3.Type;
    if ((VVar1 != 0xff) &&
       ((VVar1 != '\x03' ||
        ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_0054ec88:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                    ,0x95,"int AF_A_AlertMonsters(VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
    if (numparam != 3) {
      VVar1 = param[3].field_0.field_3.Type;
      if (VVar1 == '\x01') {
        maxdist = param[3].field_0.f;
      }
      else if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                      ,0x96,
                      "int AF_A_AlertMonsters(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      if (4 < (uint)numparam) {
        VVar1 = param[4].field_0.field_3.Type;
        if (VVar1 == '\0') {
          uVar6 = param[4].field_0.i;
        }
        else if (VVar1 != 0xff) {
          __assert_fail("param[paramnum].Type == REGT_INT",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                        ,0x97,
                        "int AF_A_AlertMonsters(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
    }
  }
LAB_0054ebcc:
  pAVar4 = emitter;
  if ((uVar6 & 1) == 0 && emitter->player == (player_t *)0x0) {
    obj = &emitter->target;
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
    pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
    if ((uVar6 & 2) == 0 || pAVar3 == (AActor *)0x0) {
      if (pAVar4 == (AActor *)0x0) {
        pAVar4 = (AActor *)0x0;
      }
      else {
        pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
        if (pAVar4->player == (player_t *)0x0) {
          pAVar4 = (AActor *)0x0;
        }
        else {
          pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
        }
      }
    }
  }
  if ((uVar6 & 4) != 0) {
    emitter = pAVar4;
  }
  if ((pAVar4 != (AActor *)0x0) && (emitter != (AActor *)0x0)) {
    P_NoiseAlert(pAVar4,emitter,false,maxdist);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_AlertMonsters)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_FLOAT_OPT(maxdist) { maxdist = 0; }
	PARAM_INT_OPT(Flags) { Flags = 0; }

	AActor * target = NULL;
	AActor * emitter = self;

	if (self->player != NULL || (Flags & AMF_TARGETEMITTER))
	{
		target = self;
	}
	else if (self->target != NULL && (Flags & AMF_TARGETNONPLAYER))
	{
		target = self->target;
	}
	else if (self->target != NULL && self->target->player != NULL)
	{
		target = self->target;
	}

	if (Flags & AMF_EMITFROMTARGET) emitter = target;

	if (target != NULL && emitter != NULL)
	{
		P_NoiseAlert(target, emitter, false, maxdist);
	}
	return 0;
}